

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O2

bool __thiscall
bssl::tls13_write_psk_binder
          (bssl *this,SSL_HANDSHAKE *hs,SSLTranscript *transcript,Span<unsigned_char> msg,
          size_t *out_binder_len)

{
  long lVar1;
  size_t *out_len;
  Span<const_unsigned_char> client_hello;
  bool bVar2;
  int iVar3;
  EVP_MD *md;
  undefined4 extraout_var;
  bool bVar4;
  Span<unsigned_char> SVar5;
  undefined1 in_stack_ffffffffffffff58;
  size_t verify_data_len;
  Span<unsigned_char> msg_local;
  uint8_t verify_data [64];
  size_t len;
  
  lVar1 = *(long *)this;
  msg_local.data_ = (uchar *)transcript;
  msg_local.size_ = (size_t)msg.data_;
  md = (EVP_MD *)ssl_session_get_digest(*(SSL_SESSION **)(lVar1 + 0x58));
  iVar3 = EVP_MD_size(md);
  len = CONCAT44(extraout_var,iVar3);
  out_len = *(size_t **)(lVar1 + 0x58);
  iVar3 = SSL_is_dtls(*(SSL **)this);
  client_hello.size_._0_1_ = iVar3 != 0;
  client_hello.data_ = (uchar *)(len + 3);
  client_hello.size_._1_7_ = 0;
  bVar2 = tls13_psk_binder((bssl *)verify_data,(uint8_t *)&verify_data_len,out_len,(SSL_SESSION *)hs
                           ,transcript,client_hello,(size_t)msg.data_,
                           (bool)in_stack_ffffffffffffff58);
  bVar4 = verify_data_len == len;
  if (bVar4 && bVar2) {
    SVar5 = Span<unsigned_char>::last(&msg_local,len);
    if (len != 0) {
      memcpy(SVar5.data_,verify_data,len);
    }
    if ((size_t *)msg.size_ != (size_t *)0x0) {
      *(size_t *)msg.size_ = verify_data_len;
    }
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x253);
  }
  return bVar4 && bVar2;
}

Assistant:

bool tls13_write_psk_binder(const SSL_HANDSHAKE *hs,
                            const SSLTranscript &transcript, Span<uint8_t> msg,
                            size_t *out_binder_len) {
  const SSL *const ssl = hs->ssl;
  const EVP_MD *digest = ssl_session_get_digest(ssl->session.get());
  const size_t hash_len = EVP_MD_size(digest);
  // We only offer one PSK, so the binders are a u16 and u8 length
  // prefix, followed by the binder. The caller is assumed to have constructed
  // |msg| with placeholder binders.
  const size_t binders_len = 3 + hash_len;
  uint8_t verify_data[EVP_MAX_MD_SIZE];
  size_t verify_data_len;
  if (!tls13_psk_binder(verify_data, &verify_data_len, ssl->session.get(),
                        transcript, msg, binders_len, SSL_is_dtls(hs->ssl)) ||
      verify_data_len != hash_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  auto msg_binder = msg.last(verify_data_len);
  OPENSSL_memcpy(msg_binder.data(), verify_data, verify_data_len);
  if (out_binder_len != nullptr) {
    *out_binder_len = verify_data_len;
  }
  return true;
}